

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

QFunctionsDiscreteNonStationary *
AlphaVectorPlanning::ImportValueFunction
          (QFunctionsDiscreteNonStationary *__return_storage_ptr__,string *filename,size_t nr,
          size_t nrA,size_t nrS)

{
  ostream *poVar1;
  uint uVar2;
  stringstream filenameT;
  ValueFunctionPOMDPDiscrete local_208;
  QFunctionsDiscrete local_1f0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0; uVar2 != nr; uVar2 = uVar2 + 1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar1 = std::operator<<(local_1a8,(string *)filename);
    poVar1 = std::operator<<(poVar1,"_t");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    ImportValueFunction(&local_208,&local_1d8);
    ValueFunctionToQ(&local_1f0,&local_208,nrA,nrS);
    std::
    vector<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>,std::allocator<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>>
    ::
    emplace_back<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              ((vector<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>,std::allocator<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>>
                *)__return_storage_ptr__,&local_1f0);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector(&local_1f0);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_208);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscreteNonStationary
AlphaVectorPlanning::ImportValueFunction(const string & filename, size_t nr,
                                         size_t nrA, size_t nrS)
{
    QFunctionsDiscreteNonStationary Q;
    for(Index t=0;t!=nr;++t)
    {
        stringstream filenameT;
        filenameT << filename << "_t" << t;
        Q.push_back(ValueFunctionToQ(
                        ImportValueFunction(filenameT.str()),nrA,nrS));
    }
    return(Q);
}